

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O1

shared_ptr<ApprovalTests::ApprovalNamer>
ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
getDefaultNamer(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *in_RDI;
  shared_ptr<ApprovalTests::ApprovalNamer> sVar2;
  undefined1 local_30 [16];
  code *local_20;
  code *local_18;
  
  DefaultNamerFactory::getDefaultNamer();
  if (local_20 != (code *)0x0) {
    (*local_18)();
    _Var1._M_pi = extraout_RDX;
    if (local_20 != (code *)0x0) {
      (*local_20)(local_30,local_30,3);
      _Var1._M_pi = extraout_RDX_00;
    }
    sVar2.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var1._M_pi;
    sVar2.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         in_RDI;
    return (shared_ptr<ApprovalTests::ApprovalNamer>)
           sVar2.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

static std::shared_ptr<ApprovalNamer> getDefaultNamer()
        {
            return DefaultNamerFactory::getDefaultNamer()();
        }